

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alg.cpp
# Opt level: O3

double __thiscall
Alg::max_cover_lazy_budget_fast_end
          (Alg *this,Graph *graph,double budget,vector<double,_std::allocator<double>_> *budget_list
          ,double epsilon,double *timeb,int mode)

{
  vector<unsigned_int,std::allocator<unsigned_int>> *pvVar1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  pointer *ppuVar2;
  undefined8 uVar3;
  size_t sVar4;
  uint uVar5;
  iterator iVar6;
  pointer pvVar7;
  pointer pvVar8;
  ulong *puVar9;
  uint *puVar10;
  void *pvVar11;
  byte bVar12;
  pointer ppVar13;
  double *pdVar14;
  uint uVar15;
  ulong uVar16;
  ostream *poVar17;
  Nodelist *this_01;
  pointer puVar18;
  pointer puVar19;
  pointer pdVar20;
  ulong *puVar21;
  pointer pvVar22;
  uint *puVar23;
  long lVar24;
  double *pdVar25;
  pointer ppVar26;
  pointer *ppuVar27;
  undefined1 auVar28 [8];
  ulong uVar29;
  __normal_iterator<std::pair<unsigned_long,_double>_*,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>
  __i;
  size_type sVar30;
  pointer ppVar31;
  int iVar32;
  vector<double,_std::allocator<double>_> *pvVar33;
  ulong uVar34;
  long lVar35;
  undefined8 *puVar36;
  ulong uVar37;
  uint uVar38;
  Alg *pAVar39;
  size_t degBound;
  ulong uVar40;
  size_type __n;
  double *pdVar41;
  long lVar42;
  long lVar43;
  pointer puVar44;
  long lVar45;
  bool bVar46;
  bool bVar47;
  double dVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  double dVar51;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined4 uVar57;
  undefined4 uVar60;
  double dVar58;
  undefined1 auVar59 [16];
  double dVar61;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
  vecNodeLastPair;
  vector<double,_std::allocator<double>_> coverage_cost;
  value_type argmaxIdx_1;
  RRsets degMap_cost;
  Nodelist vecBound;
  RRsets missMap_cost;
  vector<unsigned_long,_std::allocator<unsigned_long>_> miss_nodes_vec;
  value_type argmaxIdx;
  FRset coverage;
  RRsets degMap;
  double local_2a0;
  double local_298;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_288;
  vector<double,_std::allocator<double>_> *local_268;
  Alg *local_260;
  vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
  local_258;
  int local_240;
  uint local_23c;
  undefined8 local_238;
  undefined8 uStack_230;
  vector<double,_std::allocator<double>_> local_228;
  uint local_20c;
  ulong local_208;
  double local_200;
  long local_1f8;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_1f0;
  long local_1d8;
  double local_1d0;
  undefined1 local_1c8 [8];
  _Bit_type *p_Stack_1c0;
  _Bit_type *local_1b8;
  _Bit_pointer local_1a8;
  undefined1 local_198 [16];
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_180;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_168;
  vector<bool,_std::allocator<bool>_> local_150;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_128;
  vector<bool,_std::allocator<bool>_> local_110;
  double local_e8;
  double dStack_e0;
  double local_d0;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_c8;
  vector<bool,_std::allocator<bool>_> local_b0;
  undefined1 local_88 [16];
  long local_78;
  vector<unsigned_int,std::allocator<unsigned_int>> *local_70;
  long local_68;
  long local_60;
  double *local_58;
  long local_50;
  size_type local_48;
  long local_40;
  pointer local_38;
  
  this->__boundLast = 1.79769313486232e+308;
  this->__boundMin = 1.79769313486232e+308;
  this->__boundLast_inf = 1.79769313486232e+308;
  this->__boundMin_inf = 1.79769313486232e+308;
  this->__boundLast_inf_cost = 1.79769313486232e+308;
  this->__boundMin_inf_cost = 1.79769313486232e+308;
  local_110.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_240 = mode;
  local_58 = timeb;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_128,(ulong)this->__numV,(value_type_conflict2 *)&local_110,
             (allocator_type *)&local_b0);
  uVar16 = (ulong)this->__numV;
  if (uVar16 == 0) {
    uVar40 = 0;
  }
  else {
    ppuVar27 = (pointer *)
               ((long)&(this->__hyperG)._FRsets.
                       super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar16 - 1].
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data + 8);
    uVar40 = 0;
    do {
      uVar34 = (long)*ppuVar27 - (long)((_Vector_impl_data *)(ppuVar27 + -1))->_M_start >> 3;
      if (uVar40 < uVar34) {
        uVar40 = uVar34;
      }
      ppuVar27 = ppuVar27 + -3;
      local_128.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[uVar16 - 1] = uVar34;
      uVar16 = uVar16 - 1;
    } while (uVar16 != 0);
  }
  local_260 = this;
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector(&local_c8,uVar40 + 1,(allocator_type *)&local_110);
  uVar15 = local_260->__numV - 1;
  local_110.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p =
       (_Bit_type *)
       CONCAT44(local_110.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._4_4_,uVar15);
  if (local_260->__numV != 0) {
    do {
      if (local_128.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[uVar15] != 0) {
        pvVar1 = (vector<unsigned_int,std::allocator<unsigned_int>> *)
                 (local_c8.
                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start +
                 local_128.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_start[uVar15]);
        iVar6._M_current = *(uint **)(pvVar1 + 8);
        if (iVar6._M_current == *(uint **)(pvVar1 + 0x10)) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>(pvVar1,iVar6,(uint *)&local_110);
        }
        else {
          *iVar6._M_current = uVar15;
          *(uint **)(pvVar1 + 8) = iVar6._M_current + 1;
        }
      }
      bVar46 = (int)local_110.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != 0;
      uVar15 = (int)local_110.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p - 1;
      local_110.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p =
           (_Bit_type *)
           CONCAT44(local_110.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._4_4_,uVar15);
    } while (bVar46);
  }
  pAVar39 = local_260;
  local_b0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p._0_1_ = (allocator_type)0x0;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_110,local_260->__numRRsets,(bool *)&local_b0,(allocator_type *)local_1c8);
  local_1c8 = (undefined1  [8])((ulong)local_1c8 & 0xffffffffffffff00);
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_b0,(ulong)pAVar39->__numV,(bool *)local_1c8,(allocator_type *)&local_150);
  dVar48 = min_vector_nonzero_mask(budget_list,&local_b0);
  local_238._0_4_ = SUB84(dVar48,0);
  local_238._4_4_ = (undefined4)((ulong)dVar48 >> 0x20);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"min_cost: ",10);
  poVar17 = std::ostream::_M_insert<double>((double)CONCAT44(local_238._4_4_,(undefined4)local_238))
  ;
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar17 + -0x18) + (char)poVar17);
  std::ostream::put((char)poVar17);
  std::ostream::flush();
  puVar19 = (local_260->__vecSeed_inf).
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((local_260->__vecSeed_inf).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish != puVar19) {
    (local_260->__vecSeed_inf).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_finish = puVar19;
  }
  lVar35 = 0;
  local_268 = budget_list;
  if (((double)CONCAT44(local_238._4_4_,(undefined4)local_238) <= budget) && (uVar40 != 0)) {
    this_01 = &local_260->__vecSeed_inf;
    lVar35 = 0;
    iVar32 = 0;
    lVar45 = CONCAT44(local_238._4_4_,(undefined4)local_238);
    do {
      local_238 = (double)(uVar40 * 3);
      lVar42 = (long)local_c8.
                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar40].
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_c8.
                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar40].
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start;
      if (lVar42 != 0) {
        pvVar22 = local_c8.
                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + uVar40;
        lVar42 = lVar42 >> 2;
        do {
          local_150.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p._0_4_ =
               (pvVar22->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start[lVar42 + -1];
          lVar42 = lVar42 + -1;
          if (local_128.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start
              [(uint)local_150.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p] < uVar40) {
            pvVar1 = (vector<unsigned_int,std::allocator<unsigned_int>> *)
                     (local_c8.
                      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start +
                     local_128.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start
                     [(uint)local_150.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p]);
            iVar6._M_current = *(uint **)(pvVar1 + 8);
            if (iVar6._M_current == *(uint **)(pvVar1 + 0x10)) {
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>(pvVar1,iVar6,(uint *)&local_150);
            }
            else {
              *iVar6._M_current =
                   (uint)local_150.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
              *(uint **)(pvVar1 + 8) = iVar6._M_current + 1;
            }
          }
          else {
            if ((local_268->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start
                [(uint)local_150.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p] <= budget) {
              if (local_240 == 2) {
                local_1c8 = (undefined1  [8])0x0;
                p_Stack_1c0 = (_Bit_type *)0x0;
                local_1b8 = (_Bit_type *)0x0;
                local_228.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start._0_4_ =
                     (undefined4)
                     local_128.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start
                     [(&((local_c8.
                          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                        super__Vector_impl_data._M_start)[(long)local_238][lVar42]];
                std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                _M_realloc_insert<unsigned_int>
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1c8,
                           (iterator)0x0,(uint *)&local_228);
                lVar45 = 0;
                for (auVar28 = local_1c8; auVar28 != (undefined1  [8])p_Stack_1c0;
                    auVar28 = (undefined1  [8])((long)auVar28 + 4)) {
                  lVar45 = lVar45 + (ulong)(uint)*(_Bit_type *)auVar28;
                }
                lVar45 = lVar45 + lVar35;
                auVar49._8_4_ = (int)((ulong)lVar45 >> 0x20);
                auVar49._0_8_ = lVar45;
                auVar49._12_4_ = 0x45300000;
                sVar4 = local_260->__numRRsets;
                auVar52._8_4_ = (int)(sVar4 >> 0x20);
                auVar52._0_8_ = sVar4;
                auVar52._12_4_ = 0x45300000;
                dVar48 = ((double)local_260->__numV *
                         ((auVar49._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)lVar45) - 4503599627370496.0))) /
                         ((auVar52._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)sVar4) - 4503599627370496.0));
                local_260->__boundLast_inf = dVar48;
                if (dVar48 < local_260->__boundMin_inf) {
                  local_260->__boundMin_inf = dVar48;
                }
                if (local_1c8 != (undefined1  [8])0x0) {
                  operator_delete((void *)local_1c8,(long)local_1b8 - (long)local_1c8);
                }
              }
              if (iVar32 == 0) {
                lVar35 = lVar35 + local_128.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start
                                  [(uint)local_150.super__Bvector_base<std::allocator<bool>_>.
                                         _M_impl.super__Bvector_impl_data._M_start.
                                         super__Bit_iterator_base._M_p];
                iVar6._M_current =
                     (local_260->__vecSeed_inf).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
                if (iVar6._M_current ==
                    (local_260->__vecSeed_inf).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<unsigned_int,std::allocator<unsigned_int>>::
                  _M_realloc_insert<unsigned_int_const&>
                            ((vector<unsigned_int,std::allocator<unsigned_int>> *)this_01,iVar6,
                             (uint *)&local_150);
                }
                else {
                  *iVar6._M_current =
                       (uint)local_150.super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
                  (local_260->__vecSeed_inf).
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish = iVar6._M_current + 1;
                }
                uVar16 = (ulong)(uint)local_150.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                      super__Bvector_impl_data._M_start.super__Bit_iterator_base.
                                      _M_p;
                local_128.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[uVar16] = 0;
                pvVar8 = (local_260->__hyperG)._FRsets.
                         super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                puVar21 = pvVar8[uVar16].
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start;
                puVar9 = *(pointer *)
                          ((long)&pvVar8[uVar16].
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data + 8);
                if (puVar21 != puVar9) {
                  local_198._0_8_ = lVar35;
                  pvVar7 = (local_260->__hyperG)._RRsets.
                           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  do {
                    uVar16 = *puVar21;
                    uVar34 = uVar16 + 0x3f;
                    if (-1 < (long)uVar16) {
                      uVar34 = uVar16;
                    }
                    uVar37 = (ulong)((uVar16 & 0x800000000000003f) < 0x8000000000000001);
                    if ((local_110.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                         [((long)uVar34 >> 6) + (uVar37 - 1)] >> (uVar16 & 0x3f) & 1) == 0) {
                      local_110.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                      [((long)uVar34 >> 6) + (uVar37 - 1)] =
                           local_110.super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                           [((long)uVar34 >> 6) + (uVar37 - 1)] | 1L << ((byte)uVar16 & 0x3f);
                      puVar10 = *(pointer *)
                                 ((long)&pvVar7[uVar16].
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data + 8);
                      for (puVar23 = pvVar7[uVar16].
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_start; puVar23 != puVar10;
                          puVar23 = puVar23 + 1) {
                        if (local_128.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start[*puVar23] != 0) {
                          local_128.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start[*puVar23] =
                               local_128.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start[*puVar23] - 1;
                        }
                      }
                    }
                    puVar21 = puVar21 + 1;
                  } while (puVar21 != puVar9);
                }
              }
              iVar32 = iVar32 + 1;
            }
            if (iVar32 == 2) goto LAB_001084c0;
          }
        } while (lVar42 != 0);
        lVar45 = (long)local_238;
        if (iVar32 == 2) break;
      }
      puVar19 = local_c8.
                super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish[-1].
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start;
      pvVar22 = local_c8.
                super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish + -1;
      local_238 = (double)lVar45;
      if (puVar19 != (pointer)0x0) {
        pvVar22 = local_c8.
                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish + -1;
        local_c8.
        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_c8.
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + -1;
        operator_delete(puVar19,(long)(pvVar22->
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      )._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)puVar19);
        pvVar22 = local_c8.
                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      local_c8.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pvVar22;
      uVar40 = uVar40 - 1;
      lVar45 = (long)local_238;
    } while (uVar40 != 0);
  }
LAB_001084c0:
  pAVar39 = local_260;
  uVar15 = local_260->__numV;
  local_238._0_4_ = (undefined4)local_260->__numRRsets;
  local_238._4_4_ = (undefined4)(local_260->__numRRsets >> 0x20);
  uStack_230 = 0;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
  std::ostream::put(-0x28);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"  >>>[greedy-lazy] influence: ",0x1e);
  poVar17 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar17," ",1);
  uVar60 = SUB164(ZEXT816(0x4530000043300000),4);
  auVar55._8_4_ = (int)((ulong)lVar35 >> 0x20);
  auVar55._0_8_ = lVar35;
  auVar55._12_4_ = uVar60;
  uVar57 = SUB164(ZEXT816(0x4530000043300000),0);
  auVar56._4_4_ = local_238._4_4_;
  auVar56._0_4_ = (undefined4)local_238;
  auVar56._8_4_ = local_238._4_4_;
  auVar56._12_4_ = uVar60;
  local_d0 = ((double)uVar15 *
             ((auVar55._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(uVar57,(int)lVar35) - 4503599627370496.0))) /
             ((auVar56._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(uVar57,(undefined4)local_238) - 4503599627370496.0));
  poVar17 = std::ostream::_M_insert<double>(local_d0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar17,", min-bound: ",0xd);
  poVar17 = std::ostream::_M_insert<double>(pAVar39->__boundMin_inf);
  std::__ostream_insert<char,std::char_traits<char>>(poVar17,", last-bound: ",0xe);
  poVar17 = std::ostream::_M_insert<double>(pAVar39->__boundLast_inf);
  local_1c8[0] = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar17,local_1c8,1);
  local_1c8 = (undefined1  [8])0x0;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_228,(ulong)pAVar39->__numV,(value_type_conflict4 *)local_1c8,
             (allocator_type *)&local_150);
  iVar32 = local_240;
  uVar16 = (ulong)pAVar39->__numV;
  if (uVar16 == 0) {
    local_e8 = 0.0;
    dStack_e0 = 0.0;
    local_198 = ZEXT816(0x7fefffffffffffff);
  }
  else {
    pdVar20 = (local_268->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start;
    ppuVar27 = (pointer *)
               ((long)&(pAVar39->__hyperG)._FRsets.
                       super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar16 - 1].
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data + 8);
    local_198 = ZEXT816(0x7fefffffffffffff);
    local_e8 = 0.0;
    do {
      dVar48 = pdVar20[uVar16 - 1];
      bVar46 = 1e-10 < ABS(dVar48);
      lVar35 = (long)*ppuVar27 - (long)((_Vector_impl_data *)(ppuVar27 + -1))->_M_start;
      auVar63._8_4_ = (int)(lVar35 >> 0x23);
      auVar63._0_8_ = lVar35 >> 3;
      auVar63._12_4_ = 0x45300000;
      dStack_e0 = auVar63._8_8_ - 1.9342813113834067e+25;
      dVar48 = (dStack_e0 + ((double)CONCAT44(0x43300000,(int)(lVar35 >> 3)) - 4503599627370496.0))
               / dVar48;
      dVar51 = dVar48;
      if (lVar35 == 0 || !bVar46) {
        dVar51 = 0.0;
        dStack_e0 = 0.0;
      }
      dVar58 = local_198._0_8_;
      dVar61 = dVar58;
      if (lVar35 != 0 && bVar46) {
        uVar40 = -(ulong)(1e-10 < ABS(dVar48));
        dVar61 = (double)(~uVar40 & (ulong)dVar58 | uVar40 & (ulong)dVar51);
      }
      ppuVar27 = ppuVar27 + -3;
      *(double *)
       (CONCAT44(local_228.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start._4_4_,
                 local_228.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start._0_4_) + -8 + uVar16 * 8) = dVar51;
      dVar48 = dVar51;
      if (dVar51 <= local_e8) {
        dVar48 = local_e8;
      }
      local_e8 = dVar48;
      auVar62._0_8_ = (ulong)dVar61 & -(ulong)(dVar51 < dVar58);
      auVar62._8_8_ = local_198._8_8_ & (ulong)dStack_e0;
      auVar64._0_8_ = ~-(ulong)(dVar51 < dVar58) & (ulong)dVar58;
      auVar64._8_8_ = ~(ulong)dStack_e0 & local_198._8_8_;
      local_198 = auVar64 | auVar62;
      uVar16 = uVar16 - 1;
    } while (uVar16 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"minDeg_cost: ",0xd);
  poVar17 = std::ostream::_M_insert<double>((double)local_198._0_8_);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar17 + -0x18) + (char)poVar17);
  std::ostream::put((char)poVar17);
  std::ostream::flush();
  local_238 = 1.0 - epsilon;
  local_198._0_8_ = (double)local_198._0_8_ * local_238;
  __n = 0;
  for (dVar48 = local_e8; (double)local_198._0_8_ <= dVar48; dVar48 = dVar48 * local_238) {
    __n = __n + 1;
  }
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector(&local_1f0,__n,(allocator_type *)local_1c8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"maxIdx_cost: ",0xd);
  poVar17 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar17 + -0x18) + (char)poVar17);
  std::ostream::put((char)poVar17);
  std::ostream::flush();
  if ((double)local_198._0_8_ <= local_e8) {
    local_298 = local_e8;
    sVar30 = __n;
    do {
      sVar30 = sVar30 - 1;
      uVar15 = pAVar39->__numV - 1;
      local_1c8._0_4_ = uVar15;
      if (pAVar39->__numV != 0) {
        dVar48 = local_298 / local_238;
        do {
          dVar51 = *(double *)
                    (CONCAT44(local_228.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start._4_4_,
                              local_228.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start._0_4_) + (ulong)uVar15 * 8);
          if ((local_298 <= dVar51) && (dVar51 <= dVar48)) {
            pvVar1 = (vector<unsigned_int,std::allocator<unsigned_int>> *)
                     (local_1f0.
                      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + sVar30);
            iVar6._M_current = *(uint **)(pvVar1 + 8);
            if (iVar6._M_current == *(uint **)(pvVar1 + 0x10)) {
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>(pvVar1,iVar6,(uint *)local_1c8);
            }
            else {
              *iVar6._M_current = uVar15;
              *(uint **)(pvVar1 + 8) = iVar6._M_current + 1;
            }
          }
          bVar46 = local_1c8._0_4_ != 0;
          uVar15 = local_1c8._0_4_ - 1;
          local_1c8._0_4_ = uVar15;
        } while (bVar46);
      }
      if (sVar30 == 0) break;
      local_298 = local_298 * local_238;
    } while ((double)local_198._0_8_ <= local_298);
  }
  local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
  local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector(&local_180,__n,(allocator_type *)local_1c8);
  local_150.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p._0_4_ =
       (uint)local_150.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p & 0xffffff00;
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)local_1c8,pAVar39->__numRRsets,
             (bool *)&local_150,(allocator_type *)&local_288);
  local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((ulong)local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_150,(ulong)pAVar39->__numV,(bool *)&local_288,(allocator_type *)&local_258);
  local_2a0 = min_vector_nonzero_mask(local_268,&local_150);
  std::chrono::_V2::system_clock::now();
  puVar19 = (pAVar39->__vecSeed_inf_cost).
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((pAVar39->__vecSeed_inf_cost).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish != puVar19) {
    (pAVar39->__vecSeed_inf_cost).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_finish = puVar19;
  }
  local_208 = 0;
  if (((long)local_1f0.
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)local_1f0.
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start != 0) && (local_2a0 <= budget)) {
    local_70 = (vector<unsigned_int,std::allocator<unsigned_int>> *)&pAVar39->__vecSeed_inf_cost;
    local_1d8 = ((long)local_1f0.
                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_1f0.
                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
    local_60 = __n * 0x18 + -0x18;
    local_1d0 = 0.0;
    local_208 = 0;
    local_48 = __n;
    do {
      lVar35 = local_1d8 + -1;
      local_1f8 = lVar35 * 3;
      local_38 = local_1f0.
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + lVar35;
      lVar45 = (long)(local_38->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(local_38->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                     _M_impl.super__Vector_impl_data._M_start >> 2;
      local_78 = local_1d8 + -2;
      pvVar22 = local_1f0.
                super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_1d8 = lVar35;
      do {
        lVar35 = lVar45 + -1;
        if (lVar45 == 0) break;
        local_20c = (local_38->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_start[lVar35];
        puVar23 = (uint *)(ulong)local_20c;
        dVar48 = *(double *)
                  (CONCAT44(local_228.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start._4_4_,
                            local_228.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start._0_4_) + (long)puVar23 * 8);
        auVar59._8_8_ = 0;
        auVar59._0_8_ = dVar48;
        pdVar20 = (local_268->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        dVar51 = pdVar20[(long)puVar23];
        if (local_1d0 + dVar51 <= budget) {
          local_40 = lVar35;
          if ((iVar32 == 2) ||
             ((local_88 = auVar59, iVar32 == 1 && (budget < local_1d0 + dVar51 + local_2a0)))) {
            local_88 = auVar59;
            lVar42 = std::chrono::_V2::system_clock::now();
            lVar35 = local_60;
            pvVar33 = local_268;
            local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start = (uint *)0x0;
            local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish = (uint *)0x0;
            local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
            if ((long)local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start != 0) {
              lVar43 = (long)local_168.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)local_168.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start >> 3;
              do {
                lVar43 = lVar43 + -1;
                if ((double)local_198._0_8_ <= local_e8) {
                  dVar48 = *(double *)
                            (CONCAT44(local_228.super__Vector_base<double,_std::allocator<double>_>.
                                      _M_impl.super__Vector_impl_data._M_start._4_4_,
                                      local_228.super__Vector_base<double,_std::allocator<double>_>.
                                      _M_impl.super__Vector_impl_data._M_start._0_4_) +
                            local_168.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start[lVar43] * 8);
                  lVar24 = lVar35;
                  sVar30 = __n;
                  dVar51 = local_e8;
                  do {
                    if ((dVar51 <= dVar48) && (dVar48 <= dVar51 / local_238)) {
                      this_00 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                ((long)&((local_180.
                                          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        )._M_impl.super__Vector_impl_data._M_start + lVar24);
                      local_258.
                      super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start._0_4_ =
                           (uint)local_168.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start[lVar43];
                      iVar6._M_current =
                           *(uint **)((long)&((local_180.
                                               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->
                                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                             )._M_impl.super__Vector_impl_data._M_finish + lVar24);
                      if (iVar6._M_current ==
                          *(uint **)((long)&((local_180.
                                              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->
                                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                            )._M_impl.super__Vector_impl_data._M_end_of_storage +
                                    lVar24)) {
                        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                        _M_realloc_insert<unsigned_int>(this_00,iVar6,(uint *)&local_258);
                      }
                      else {
                        *iVar6._M_current =
                             (uint)local_258.
                                   super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start;
                        (this_00->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                        _M_impl.super__Vector_impl_data._M_finish = iVar6._M_current + 1;
                      }
                      break;
                    }
                    sVar30 = sVar30 - 1;
                    if (sVar30 == 0) break;
                    lVar24 = lVar24 + -0x18;
                    dVar51 = dVar51 * local_238;
                  } while ((double)local_198._0_8_ <= dVar51);
                }
              } while (lVar43 != 0);
            }
            puVar19 = (&((local_180.
                          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                        super__Vector_impl_data._M_finish)[local_1f8];
            puVar44 = (&((local_180.
                          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                        super__Vector_impl_data._M_start)[local_1f8];
            if (local_2a0 <= budget) {
              local_298 = 0.0;
              lVar35 = 0;
              do {
                bVar46 = lVar45 == 0;
                lVar45 = lVar45 + -1;
                if (bVar46) {
                  lVar45 = -1;
                  break;
                }
                puVar18 = (&((local_1f0.
                              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                            .super__Vector_impl_data._M_start)[local_1f8];
                uVar16 = (ulong)puVar18[lVar45];
                pdVar20 = (pvVar33->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                          super__Vector_impl_data._M_start;
                if (budget < local_298 + pdVar20[uVar16]) {
                  local_258.
                  super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start._0_4_ =
                       (uint)(long)((budget - local_298) *
                                   *(double *)
                                    (CONCAT44(local_228.
                                              super__Vector_base<double,_std::allocator<double>_>.
                                              _M_impl.super__Vector_impl_data._M_start._4_4_,
                                              local_228.
                                              super__Vector_base<double,_std::allocator<double>_>.
                                              _M_impl.super__Vector_impl_data._M_start._0_4_) +
                                    uVar16 * 8));
                  if (local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_finish ==
                      local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage) {
                    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                    _M_realloc_insert<unsigned_int>
                              (&local_288,
                               (iterator)
                               local_288.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_finish,(uint *)&local_258);
                  }
                  else {
                    *local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish =
                         (uint)local_258.
                               super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                               ._M_impl.super__Vector_impl_data._M_start;
                    local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_finish =
                         local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_finish + 1;
                  }
                  bVar46 = true;
                  local_298 = budget;
                  goto LAB_00108e2c;
                }
                local_258.
                super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_start._0_4_ =
                     (uint)(long)(pdVar20[uVar16] *
                                 *(double *)
                                  (CONCAT44(local_228.
                                            super__Vector_base<double,_std::allocator<double>_>.
                                            _M_impl.super__Vector_impl_data._M_start._4_4_,
                                            local_228.
                                            super__Vector_base<double,_std::allocator<double>_>.
                                            _M_impl.super__Vector_impl_data._M_start._0_4_) +
                                  uVar16 * 8));
                if (local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_finish ==
                    local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                  _M_realloc_insert<unsigned_int>
                            (&local_288,
                             (iterator)
                             local_288.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_finish,(uint *)&local_258);
                  puVar18 = (&((local_1f0.
                                super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                              _M_impl.super__Vector_impl_data._M_start)[local_1f8];
                  pdVar20 = (pvVar33->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                            super__Vector_impl_data._M_start;
                }
                else {
                  *local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_finish =
                       (uint)local_258.
                             super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                  local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish =
                       local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish + 1;
                }
                local_298 = local_298 + pdVar20[puVar18[lVar45]];
                lVar35 = lVar35 + 1;
              } while (local_2a0 + local_298 <= budget);
              bVar46 = false;
            }
            else {
              local_298 = 0.0;
              lVar35 = 0;
              bVar46 = false;
            }
LAB_00108e2c:
            dVar48 = local_2a0 + local_298;
            local_50 = lVar42;
            if (dVar48 <= budget) {
              lVar43 = (long)puVar19 - (long)puVar44 >> 2;
              lVar42 = lVar35 + lVar43;
              do {
                bVar47 = lVar43 == 0;
                lVar43 = lVar43 + -1;
                if (bVar47) {
                  dVar48 = local_2a0 + local_298;
                  lVar35 = lVar42;
                  break;
                }
                puVar19 = (&((local_180.
                              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                            .super__Vector_impl_data._M_start)[local_1f8];
                uVar16 = (ulong)puVar19[lVar43];
                pdVar20 = (pvVar33->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                          super__Vector_impl_data._M_start;
                if (budget < local_298 + pdVar20[uVar16]) {
                  local_258.
                  super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start._0_4_ =
                       (uint)(long)((budget - local_298) *
                                   *(double *)
                                    (CONCAT44(local_228.
                                              super__Vector_base<double,_std::allocator<double>_>.
                                              _M_impl.super__Vector_impl_data._M_start._4_4_,
                                              local_228.
                                              super__Vector_base<double,_std::allocator<double>_>.
                                              _M_impl.super__Vector_impl_data._M_start._0_4_) +
                                    uVar16 * 8));
                  if (local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_finish ==
                      local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage) {
                    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                    _M_realloc_insert<unsigned_int>
                              (&local_288,
                               (iterator)
                               local_288.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_finish,(uint *)&local_258);
                  }
                  else {
                    *local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish =
                         (uint)local_258.
                               super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                               ._M_impl.super__Vector_impl_data._M_start;
                    local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_finish =
                         local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_finish + 1;
                  }
                  local_200 = 0.0;
                  lVar42 = local_1d8;
                  local_298 = budget;
                  goto LAB_00109306;
                }
                local_258.
                super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_start._0_4_ =
                     (uint)(long)(pdVar20[uVar16] *
                                 *(double *)
                                  (CONCAT44(local_228.
                                            super__Vector_base<double,_std::allocator<double>_>.
                                            _M_impl.super__Vector_impl_data._M_start._4_4_,
                                            local_228.
                                            super__Vector_base<double,_std::allocator<double>_>.
                                            _M_impl.super__Vector_impl_data._M_start._0_4_) +
                                  uVar16 * 8));
                if (local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_finish ==
                    local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                  _M_realloc_insert<unsigned_int>
                            (&local_288,
                             (iterator)
                             local_288.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_finish,(uint *)&local_258);
                  puVar19 = (&((local_180.
                                super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                              _M_impl.super__Vector_impl_data._M_start)[local_1f8];
                  pdVar20 = (pvVar33->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                            super__Vector_impl_data._M_start;
                }
                else {
                  *local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_finish =
                       (uint)local_258.
                             super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                  local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish =
                       local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish + 1;
                }
                local_298 = local_298 + pdVar20[puVar19[lVar43]];
                lVar35 = lVar35 + 1;
                dVar48 = local_2a0 + local_298;
              } while (dVar48 <= budget);
            }
            local_200 = 0.0;
            lVar42 = local_1d8;
            lVar43 = local_78;
            if (!bVar46 && dVar48 <= budget) {
              for (; lVar43 != 0; lVar43 = lVar43 + -1) {
                puVar18 = local_1f0.
                          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[lVar43].
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start;
                lVar42 = (long)local_1f0.
                               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[lVar43].
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_finish - (long)puVar18 >> 2;
                puVar19 = local_180.
                          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[lVar43].
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_finish;
                puVar44 = local_180.
                          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[lVar43].
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start;
                lVar45 = lVar42;
                local_200 = local_298;
                if (local_2a0 + local_298 <= budget) {
                  lVar35 = 0;
                  do {
                    bVar46 = lVar45 == 0;
                    lVar45 = lVar45 + -1;
                    if (bVar46) {
                      lVar45 = -1;
                      lVar35 = lVar42;
                      break;
                    }
                    uVar16 = (ulong)puVar18[lVar45];
                    pdVar20 = (pvVar33->super__Vector_base<double,_std::allocator<double>_>)._M_impl
                              .super__Vector_impl_data._M_start;
                    if (budget < local_298 + pdVar20[uVar16]) {
                      local_258.
                      super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start._0_4_ =
                           (uint)(long)((budget - local_298) *
                                       *(double *)
                                        (CONCAT44(local_228.
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                                  local_228.
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._0_4_) +
                                        uVar16 * 8));
                      if (local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_finish ==
                          local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage) {
                        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                        _M_realloc_insert<unsigned_int>
                                  (&local_288,
                                   (iterator)
                                   local_288.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish,(uint *)&local_258);
                      }
                      else {
                        *local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_finish =
                             (uint)local_258.
                                   super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start;
                        local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_finish =
                             local_288.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_finish + 1;
                      }
                      bVar12 = 1;
                      local_298 = budget;
                      goto LAB_00109106;
                    }
                    local_258.
                    super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start._0_4_ =
                         (uint)(long)(pdVar20[uVar16] *
                                     *(double *)
                                      (CONCAT44(local_228.
                                                super__Vector_base<double,_std::allocator<double>_>.
                                                _M_impl.super__Vector_impl_data._M_start._4_4_,
                                                local_228.
                                                super__Vector_base<double,_std::allocator<double>_>.
                                                _M_impl.super__Vector_impl_data._M_start._0_4_) +
                                      uVar16 * 8));
                    if (local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_finish ==
                        local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage) {
                      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                      _M_realloc_insert<unsigned_int>
                                (&local_288,
                                 (iterator)
                                 local_288.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_finish,(uint *)&local_258);
                      pdVar20 = (pvVar33->super__Vector_base<double,_std::allocator<double>_>).
                                _M_impl.super__Vector_impl_data._M_start;
                      puVar18 = local_1f0.
                                super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[lVar43].
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start;
                    }
                    else {
                      *local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish =
                           (uint)local_258.
                                 super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start;
                      local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_finish =
                           local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_finish + 1;
                    }
                    local_298 = local_298 + pdVar20[puVar18[lVar45]];
                    lVar35 = lVar35 + 1;
                  } while (local_2a0 + local_298 <= budget);
                  bVar12 = 0;
                }
                else {
                  lVar35 = 0;
                  bVar12 = 0;
                }
LAB_00109106:
                dVar48 = local_2a0 + local_298;
                lVar42 = lVar43;
                if (dVar48 <= budget) {
                  lVar24 = (long)puVar19 - (long)puVar44 >> 2;
                  local_68 = lVar35 + lVar24;
                  do {
                    bVar46 = lVar24 == 0;
                    lVar24 = lVar24 + -1;
                    if (bVar46) {
                      dVar48 = local_2a0 + local_298;
                      lVar35 = local_68;
                      break;
                    }
                    puVar19 = local_180.
                              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[lVar43].
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start;
                    uVar16 = (ulong)puVar19[lVar24];
                    pdVar20 = (local_268->super__Vector_base<double,_std::allocator<double>_>).
                              _M_impl.super__Vector_impl_data._M_start;
                    if (budget < local_298 + pdVar20[uVar16]) {
                      local_258.
                      super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start._0_4_ =
                           (uint)(long)((budget - local_298) *
                                       *(double *)
                                        (CONCAT44(local_228.
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                                  local_228.
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._0_4_) +
                                        uVar16 * 8));
                      if (local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_finish ==
                          local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage) {
                        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                        _M_realloc_insert<unsigned_int>
                                  (&local_288,
                                   (iterator)
                                   local_288.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish,(uint *)&local_258);
                        pvVar33 = local_268;
                        local_298 = budget;
                      }
                      else {
                        *local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_finish =
                             (uint)local_258.
                                   super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start;
                        local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_finish =
                             local_288.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_finish + 1;
                        pvVar33 = local_268;
                        local_298 = budget;
                      }
                      goto LAB_00109306;
                    }
                    local_258.
                    super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start._0_4_ =
                         (uint)(long)(pdVar20[uVar16] *
                                     *(double *)
                                      (CONCAT44(local_228.
                                                super__Vector_base<double,_std::allocator<double>_>.
                                                _M_impl.super__Vector_impl_data._M_start._4_4_,
                                                local_228.
                                                super__Vector_base<double,_std::allocator<double>_>.
                                                _M_impl.super__Vector_impl_data._M_start._0_4_) +
                                      uVar16 * 8));
                    if (local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_finish ==
                        local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage) {
                      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                      _M_realloc_insert<unsigned_int>
                                (&local_288,
                                 (iterator)
                                 local_288.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_finish,(uint *)&local_258);
                      puVar19 = local_180.
                                super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[lVar43].
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start;
                      pdVar20 = (local_268->super__Vector_base<double,_std::allocator<double>_>).
                                _M_impl.super__Vector_impl_data._M_start;
                    }
                    else {
                      *local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish =
                           (uint)local_258.
                                 super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start;
                      local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_finish =
                           local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_finish + 1;
                    }
                    local_298 = local_298 + pdVar20[puVar19[lVar24]];
                    lVar35 = lVar35 + 1;
                    dVar48 = local_2a0 + local_298;
                  } while (dVar48 <= budget);
                }
                pvVar33 = local_268;
                if ((bool)(bVar12 | budget < dVar48)) goto LAB_00109306;
              }
              lVar42 = 0;
            }
LAB_00109306:
            if ((lVar35 == 0) || (lVar45 == 0)) {
              if ((local_298 < budget) && (lVar45 == 0)) {
                lVar42 = lVar42 + -1;
                puVar19 = local_1f0.
                          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[lVar42].
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start;
                lVar35 = (long)local_1f0.
                               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[lVar42].
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_finish - (long)puVar19;
                if (lVar35 == 0) {
                  dVar48 = 0.0;
                }
                else {
                  lVar35 = lVar35 >> 2;
                  dVar48 = 0.0;
                  do {
                    dVar51 = *(double *)
                              (CONCAT44(local_228.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_start._4_4_,
                                        local_228.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_start._0_4_) +
                              (ulong)puVar19[lVar35 + -1] * 8);
                    if (dVar51 <= dVar48) {
                      dVar51 = dVar48;
                    }
                    dVar48 = dVar51;
                    lVar35 = lVar35 + -1;
                  } while (lVar35 != 0);
                }
                puVar19 = local_180.
                          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[lVar42].
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start;
                lVar35 = (long)local_180.
                               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[lVar42].
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_finish - (long)puVar19;
                if (lVar35 != 0) {
                  lVar35 = lVar35 >> 2;
                  dVar51 = dVar48;
                  do {
                    dVar48 = *(double *)
                              (CONCAT44(local_228.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_start._4_4_,
                                        local_228.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_start._0_4_) +
                              (ulong)puVar19[lVar35 + -1] * 8);
                    if (dVar48 <= dVar51) {
                      dVar48 = dVar51;
                    }
                    lVar35 = lVar35 + -1;
                    dVar51 = dVar48;
                  } while (lVar35 != 0);
                }
                local_258.
                super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_start._0_4_ =
                     (uint)(long)((budget - local_298) * dVar48);
                if (local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_finish ==
                    local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                  _M_realloc_insert<unsigned_int>
                            (&local_288,
                             (iterator)
                             local_288.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_finish,(uint *)&local_258);
                }
                else {
                  *local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_finish =
                       (uint)local_258.
                             super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                  local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish =
                       local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish + 1;
                }
              }
            }
            else {
              local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_finish + -lVar35;
              std::
              vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
              ::vector(&local_258,
                       ((long)local_180.
                              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[lVar42].
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)local_180.
                              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[lVar42].
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start >> 2) +
                       ((long)local_1f0.
                              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[lVar42].
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)local_1f0.
                              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[lVar42].
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start >> 2),
                       (allocator_type *)&local_23c);
              ppVar13 = local_258.
                        super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              puVar19 = local_1f0.
                        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[lVar42].
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start;
              puVar44 = local_1f0.
                        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[lVar42].
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_finish;
              lVar35 = (long)puVar44 - (long)puVar19 >> 2;
              if (puVar44 != puVar19) {
                puVar36 = (undefined8 *)
                          (CONCAT44(local_258.
                                    super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                    (uint)local_258.
                                          super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start) + lVar35 * 0x10
                          + -8);
                lVar45 = lVar35;
                do {
                  lVar43 = lVar45 + -1;
                  lVar45 = lVar45 + -1;
                  uVar3 = *(undefined8 *)
                           (CONCAT44(local_228.super__Vector_base<double,_std::allocator<double>_>.
                                     _M_impl.super__Vector_impl_data._M_start._4_4_,
                                     local_228.super__Vector_base<double,_std::allocator<double>_>.
                                     _M_impl.super__Vector_impl_data._M_start._0_4_) +
                           (ulong)puVar19[lVar43] * 8);
                  puVar36[-1] = (ulong)puVar19[lVar43];
                  *puVar36 = uVar3;
                  puVar36 = puVar36 + -2;
                } while (lVar45 != 0);
              }
              puVar19 = local_180.
                        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[lVar42].
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start;
              lVar45 = (long)local_180.
                             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[lVar42].
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_finish - (long)puVar19;
              if (lVar45 != 0) {
                lVar43 = lVar45 >> 2;
                puVar36 = (undefined8 *)
                          (lVar35 * 0x10 + lVar45 * 4 +
                           CONCAT44(local_258.
                                    super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                    (uint)local_258.
                                          super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start) + -8);
                do {
                  uVar16 = (ulong)puVar19[lVar43 + -1];
                  lVar43 = lVar43 + -1;
                  uVar3 = *(undefined8 *)
                           (CONCAT44(local_228.super__Vector_base<double,_std::allocator<double>_>.
                                     _M_impl.super__Vector_impl_data._M_start._4_4_,
                                     local_228.super__Vector_base<double,_std::allocator<double>_>.
                                     _M_impl.super__Vector_impl_data._M_start._0_4_) + uVar16 * 8);
                  puVar36[-1] = uVar16;
                  *puVar36 = uVar3;
                  puVar36 = puVar36 + -2;
                } while (lVar43 != 0);
              }
              ppVar26 = (pointer)CONCAT44(local_258.
                                          super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                          (uint)local_258.
                                                super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start);
              if (ppVar26 !=
                  local_258.
                  super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
                lVar45 = (long)local_258.
                               super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar26;
                uVar16 = lVar45 >> 4;
                lVar35 = 0x3f;
                if (uVar16 != 0) {
                  for (; uVar16 >> lVar35 == 0; lVar35 = lVar35 + -1) {
                  }
                }
                std::
                __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,double>*,std::vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<Alg::max_cover_lazy_budget_fast_end(std::vector<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,std::allocator<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>>>const&,double,std::vector<double,std::allocator<double>>const&,double,double&,int)::__0>>
                          (ppVar26,local_258.
                                   super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish,
                           ((uint)lVar35 ^ 0x3f) * 2 ^ 0x7e);
                if (lVar45 < 0x101) {
                  std::
                  __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,double>*,std::vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>>,__gnu_cxx::__ops::_Iter_comp_iter<Alg::max_cover_lazy_budget_fast_end(std::vector<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,std::allocator<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>>>const&,double,std::vector<double,std::allocator<double>>const&,double,double&,int)::__0>>
                            (ppVar26,ppVar13);
                }
                else {
                  ppVar31 = ppVar26 + 0x10;
                  std::
                  __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,double>*,std::vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>>,__gnu_cxx::__ops::_Iter_comp_iter<Alg::max_cover_lazy_budget_fast_end(std::vector<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,std::allocator<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>>>const&,double,std::vector<double,std::allocator<double>>const&,double,double&,int)::__0>>
                            (ppVar26,ppVar31);
                  if (ppVar31 != ppVar13) {
                    pdVar41 = &ppVar26[0x10].second;
                    do {
                      dVar61 = (double)ppVar31->first;
                      dVar48 = ppVar31->second;
                      dVar51 = ppVar31[-1].second;
                      ppVar26 = ppVar31;
                      pdVar14 = pdVar41;
                      if (dVar48 < dVar51) {
                        do {
                          pdVar25 = pdVar14;
                          ((pair<unsigned_long,_double> *)(pdVar25 + -1))->first =
                               (unsigned_long)pdVar25[-3];
                          *pdVar25 = dVar51;
                          dVar51 = pdVar25[-4];
                          pdVar14 = pdVar25 + -2;
                        } while (dVar48 < dVar51);
                        ppVar26 = (pointer)(pdVar25 + -3);
                      }
                      ppVar26->first = (unsigned_long)dVar61;
                      ppVar26->second = dVar48;
                      ppVar31 = ppVar31 + 1;
                      pdVar41 = pdVar41 + 2;
                    } while (ppVar31 != ppVar13);
                  }
                }
              }
              if (local_2a0 + local_200 <= budget) {
                lVar35 = (long)local_180.
                               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[lVar42].
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)local_180.
                               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[lVar42].
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start >> 2;
                lVar45 = (long)local_1f0.
                               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[lVar42].
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)local_1f0.
                               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[lVar42].
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start >> 2;
                lVar42 = (lVar35 + lVar45) * 0x10;
                lVar35 = lVar35 + lVar45 + 1;
                do {
                  lVar42 = lVar42 + -0x10;
                  lVar35 = lVar35 + -1;
                  if (lVar35 == 0) break;
                  lVar45 = *(long *)(CONCAT44(local_258.
                                              super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                              (uint)local_258.
                                                                                                        
                                                  super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) +
                                    lVar42);
                  pdVar20 = (pvVar33->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                            super__Vector_impl_data._M_start;
                  if (local_200 + pdVar20[lVar45] <= budget) {
                    local_23c = (uint)(long)(pdVar20[lVar45] *
                                            *(double *)
                                             (CONCAT44(local_228.
                                                                                                              
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                                  local_228.
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._0_4_) +
                                             lVar45 * 8));
                    if (local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_finish ==
                        local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage) {
                      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                      _M_realloc_insert<unsigned_int>
                                (&local_288,
                                 (iterator)
                                 local_288.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_finish,&local_23c);
                      pdVar20 = (pvVar33->super__Vector_base<double,_std::allocator<double>_>).
                                _M_impl.super__Vector_impl_data._M_start;
                    }
                    else {
                      *local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish = local_23c;
                      local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_finish =
                           local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_finish + 1;
                    }
                    local_200 = local_200 +
                                pdVar20[*(long *)(CONCAT44(local_258.
                                                                                                                      
                                                  super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                                  (uint)local_258.
                                                                                                                
                                                  super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) +
                                                 lVar42)];
                  }
                  else {
                    local_23c = (uint)(long)((budget - local_200) *
                                            *(double *)
                                             (CONCAT44(local_228.
                                                                                                              
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                                  local_228.
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._0_4_) +
                                             lVar45 * 8));
                    if (local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_finish ==
                        local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage) {
                      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                      _M_realloc_insert<unsigned_int>
                                (&local_288,
                                 (iterator)
                                 local_288.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_finish,&local_23c);
                      local_200 = budget;
                    }
                    else {
                      *local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish = local_23c;
                      local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_finish =
                           local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_finish + 1;
                      local_200 = budget;
                    }
                  }
                } while (local_2a0 + local_200 <= budget);
              }
              pvVar11 = (void *)CONCAT44(local_258.
                                         super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                         (uint)local_258.
                                               super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start);
              if (pvVar11 != (void *)0x0) {
                operator_delete(pvVar11,(long)local_258.
                                              super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                        (long)pvVar11);
              }
            }
            puVar44 = local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
            puVar19 = local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            pAVar39 = local_260;
            iVar32 = local_240;
            if (local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start !=
                local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              uVar16 = (long)local_288.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_finish -
                       (long)local_288.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start >> 2;
              lVar35 = 0x3f;
              if (uVar16 != 0) {
                for (; uVar16 >> lVar35 == 0; lVar35 = lVar35 + -1) {
                }
              }
              std::
              __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                        (local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start,
                         local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_finish,((uint)lVar35 ^ 0x3f) * 2 ^ 0x7e)
              ;
              iVar32 = local_240;
              pAVar39 = local_260;
              std::
              __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                        (puVar19,puVar44);
              puVar19 = local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_finish;
            }
            uVar16 = (long)puVar19 -
                     (long)local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 2;
            if ((1 < uVar16) && (1 < uVar16 + 1)) {
              uVar40 = uVar16 + 1 >> 1;
              do {
                uVar29 = uVar40 - 1;
                uVar15 = local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start[uVar40 - 1];
                uVar34 = uVar40 * 2 - 1;
                uVar37 = uVar29;
                if (uVar34 < uVar16) {
                  lVar35 = uVar40 * 2 + -2;
                  do {
                    uVar5 = local_288.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar34];
                    uVar40 = uVar34;
                    uVar38 = uVar5;
                    if ((lVar35 + 2U != uVar16) &&
                       (uVar40 = lVar35 + 2U,
                       uVar38 = local_288.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start[lVar35 + 2],
                       uVar5 < local_288.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start[lVar35 + 2])) {
                      uVar40 = uVar34;
                      uVar38 = uVar5;
                    }
                    if (uVar15 <= uVar38) break;
                    local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar37] = uVar38;
                    lVar35 = uVar40 * 2;
                    uVar34 = uVar40 * 2 + 1;
                    uVar37 = uVar40;
                  } while (uVar34 < uVar16);
                }
                local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar37] = uVar15;
                uVar40 = uVar29;
              } while (uVar29 != 0);
            }
            lVar35 = 0;
            for (puVar44 = local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_start; puVar44 != puVar19;
                puVar44 = puVar44 + 1) {
              lVar35 = lVar35 + (ulong)*puVar44;
            }
            lVar35 = lVar35 + local_208;
            auVar50._8_4_ = (int)((ulong)lVar35 >> 0x20);
            auVar50._0_8_ = lVar35;
            auVar50._12_4_ = 0x45300000;
            sVar4 = pAVar39->__numRRsets;
            auVar53._8_4_ = (int)(sVar4 >> 0x20);
            auVar53._0_8_ = sVar4;
            auVar53._12_4_ = 0x45300000;
            dVar48 = ((double)pAVar39->__numV *
                     ((auVar50._8_8_ - DAT_00132090._8_8_) +
                     ((double)CONCAT44(0x43300000,(int)lVar35) - (double)DAT_00132090))) /
                     ((auVar53._8_8_ - DAT_00132090._8_8_) +
                     ((double)CONCAT44(0x43300000,(int)sVar4) - (double)DAT_00132090));
            pAVar39->__boundLast_inf_cost = dVar48;
            if (dVar48 < pAVar39->__boundMin_inf_cost) {
              pAVar39->__boundMin_inf_cost = dVar48;
            }
            lVar35 = std::chrono::_V2::system_clock::now();
            *local_58 = (double)(lVar35 - local_50) / 1000000000.0 + *local_58;
            if (local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start != (uint *)0x0) {
              operator_delete(local_288.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_288.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_288.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
            pdVar20 = (local_268->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_start;
            dVar51 = pdVar20[local_20c];
          }
          auVar54._0_8_ = (double)CONCAT44(0x43300000,(int)local_208);
          auVar54._8_4_ = (int)(local_208 >> 0x20);
          auVar54._12_4_ = 0x45300000;
          dVar48 = (double)local_88._0_8_ * dVar51 +
                   (auVar54._8_8_ - 1.9342813113834067e+25) + (auVar54._0_8_ - 4503599627370496.0);
          local_88._0_8_ = dVar48;
          iVar6._M_current =
               (pAVar39->__vecSeed_inf_cost).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar6._M_current ==
              (pAVar39->__vecSeed_inf_cost).
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,std::allocator<unsigned_int>>::
            _M_realloc_insert<unsigned_int_const&>(local_70,iVar6,&local_20c);
            pdVar20 = (local_268->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_start;
          }
          else {
            *iVar6._M_current = local_20c;
            (pAVar39->__vecSeed_inf_cost).
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar6._M_current + 1;
          }
          uVar16 = (ulong)local_20c;
          local_1d0 = local_1d0 + pdVar20[uVar16];
          lVar35 = CONCAT44(local_228.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start._4_4_,
                            local_228.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start._0_4_);
          *(undefined8 *)(lVar35 + uVar16 * 8) = 0;
          puVar21 = (ulong *)(CONCAT44(local_150.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                       super__Bvector_impl_data._M_start.super__Bit_iterator_base.
                                       _M_p._4_4_,
                                       (uint)local_150.super__Bvector_base<std::allocator<bool>_>.
                                             _M_impl.super__Bvector_impl_data._M_start.
                                             super__Bit_iterator_base._M_p) +
                             (ulong)(local_20c >> 6) * 8);
          *puVar21 = *puVar21 | 1L << ((byte)local_20c & 0x3f);
          local_2a0 = min_vector_nonzero_mask(local_268,&local_150);
          pvVar8 = (pAVar39->__hyperG)._FRsets.
                   super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          puVar21 = pvVar8[uVar16].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          puVar9 = *(pointer *)
                    ((long)&pvVar8[uVar16].
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data + 8);
          if (puVar21 != puVar9) {
            pvVar22 = (pAVar39->__hyperG)._RRsets.
                      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            do {
              uVar16 = *puVar21;
              uVar40 = uVar16 + 0x3f;
              if (-1 < (long)uVar16) {
                uVar40 = uVar16;
              }
              uVar34 = (ulong)((uVar16 & 0x800000000000003f) < 0x8000000000000001);
              if ((*(ulong *)((long)local_1c8 + (((long)uVar40 >> 6) + (uVar34 - 1)) * 8) >>
                   (uVar16 & 0x3f) & 1) == 0) {
                *(ulong *)((long)local_1c8 + (((long)uVar40 >> 6) + (uVar34 - 1)) * 8) =
                     *(ulong *)((long)local_1c8 + (((long)uVar40 >> 6) + (uVar34 - 1)) * 8) |
                     1L << ((byte)uVar16 & 0x3f);
                puVar10 = *(pointer *)
                           ((long)&pvVar22[uVar16].
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data + 8);
                for (puVar23 = pvVar22[uVar16].
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start; puVar23 != puVar10;
                    puVar23 = puVar23 + 1) {
                  uVar16 = (ulong)*puVar23;
                  dVar51 = *(double *)(lVar35 + uVar16 * 8);
                  if (1e-10 < ABS(dVar51)) {
                    dVar61 = pdVar20[uVar16];
                    *(ulong *)(lVar35 + uVar16 * 8) =
                         ~-(ulong)(ABS(dVar61) < 1e-10) & (ulong)((dVar51 * dVar61 + -1.0) / dVar61)
                    ;
                  }
                }
              }
              puVar21 = puVar21 + 1;
            } while (puVar21 != puVar9);
          }
          local_208 = (long)(dVar48 - 9.223372036854776e+18) & (long)(double)local_88._0_8_ >> 0x3f
                      | (long)(double)local_88._0_8_;
          pvVar22 = local_1f0.
                    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          __n = local_48;
          lVar45 = local_40;
        }
        else {
          lVar45 = lVar35;
          if (1e-10 < ABS(dVar48)) {
            local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start = puVar23;
            if (local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
              _M_realloc_insert<unsigned_long>
                        (&local_168,
                         (iterator)
                         local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         ._M_impl.super__Vector_impl_data._M_finish,(unsigned_long *)&local_288);
              pvVar22 = local_1f0.
                        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            }
            else {
              *local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish = (unsigned_long)puVar23;
              local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish + 1;
            }
          }
        }
        ppuVar2 = &(pvVar22->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                   _M_impl.super__Vector_impl_data._M_finish + local_1f8;
        *ppuVar2 = *ppuVar2 + -1;
      } while (local_1d0 + local_2a0 <= budget);
      puVar19 = local_1f0.
                super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish[-1].
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start;
      pvVar22 = local_1f0.
                super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish + -1;
      if (puVar19 != (pointer)0x0) {
        pvVar22 = local_1f0.
                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish + -1;
        local_1f0.
        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_1f0.
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + -1;
        operator_delete(puVar19,(long)(pvVar22->
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      )._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)puVar19);
        pvVar22 = local_1f0.
                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      local_1f0.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pvVar22;
    } while ((local_1d8 != 0) && (local_1d0 + local_2a0 <= budget));
  }
  uVar15 = pAVar39->__numV;
  local_238._0_4_ = (undefined4)pAVar39->__numRRsets;
  local_238._4_4_ = (undefined4)(pAVar39->__numRRsets >> 0x20);
  uStack_230 = 0;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"  >>>[greedy-lazy] influence_cost: ",0x23);
  poVar17 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar17," ",1);
  local_238 = ((double)uVar15 *
              (((double)CONCAT44(0x45300000,(int)(local_208 >> 0x20)) - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)local_208) - 4503599627370496.0))) /
              (((double)CONCAT44(0x45300000,local_238._4_4_) - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(undefined4)local_238) - 4503599627370496.0));
  poVar17 = std::ostream::_M_insert<double>(local_238);
  std::__ostream_insert<char,std::char_traits<char>>(poVar17,", min-bound_cost: ",0x12);
  poVar17 = std::ostream::_M_insert<double>(pAVar39->__boundMin_inf_cost);
  std::__ostream_insert<char,std::char_traits<char>>(poVar17,", last-bound_cost: ",0x13);
  poVar17 = std::ostream::_M_insert<double>(pAVar39->__boundLast_inf_cost);
  local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(local_288.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start._1_7_,10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar17,(char *)&local_288,1);
  puVar19 = (pAVar39->__vecSeed).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start;
  puVar44 = (pAVar39->__vecSeed).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (local_d0 <= local_238) {
    if (puVar44 != puVar19) {
      (pAVar39->__vecSeed).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar19;
    }
    std::vector<unsigned_int,std::allocator<unsigned_int>>::
    _M_assign_aux<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)&pAVar39->__vecSeed,
               (pAVar39->__vecSeed_inf_cost).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start,
               (pAVar39->__vecSeed_inf_cost).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Cost Inf: ",10);
    poVar17 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar17 + -0x18) + (char)poVar17);
    std::ostream::put((char)poVar17);
    bVar46 = true;
    std::ostream::flush();
  }
  else {
    if (puVar44 != puVar19) {
      (pAVar39->__vecSeed).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar19;
    }
    std::vector<unsigned_int,std::allocator<unsigned_int>>::
    _M_assign_aux<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)&pAVar39->__vecSeed,
               (pAVar39->__vecSeed_inf).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start,
               (pAVar39->__vecSeed_inf).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Inf: ",5);
    poVar17 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar17 + -0x18) + (char)poVar17);
    std::ostream::put((char)poVar17);
    std::ostream::flush();
    bVar46 = false;
    local_238 = local_d0;
  }
  pAVar39->__is_inf_cost = bVar46;
  pvVar11 = (void *)CONCAT44(local_150.super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._4_4_,
                             (uint)local_150.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  if (pvVar11 != (void *)0x0) {
    operator_delete(pvVar11,(long)local_150.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                  super__Bvector_impl_data._M_end_of_storage - (long)pvVar11);
  }
  if (local_1c8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_1c8,(long)local_1a8 - (long)local_1c8);
    local_1c8 = (undefined1  [8])0x0;
  }
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&local_180);
  if (local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_168.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_168.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&local_1f0);
  pvVar11 = (void *)CONCAT44(local_228.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start._4_4_,
                             local_228.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start._0_4_);
  if (pvVar11 != (void *)0x0) {
    operator_delete(pvVar11,(long)local_228.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar11)
    ;
  }
  pvVar11 = (void *)CONCAT71(local_b0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._1_7_,
                             local_b0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._0_1_);
  if (pvVar11 != (void *)0x0) {
    operator_delete(pvVar11,(long)local_b0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                  super__Bvector_impl_data._M_end_of_storage - (long)pvVar11);
  }
  if (local_110.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_110.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_110.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_110.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_110.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  }
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&local_c8);
  if (local_128.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_128.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_128.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_128.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return local_238;
}

Assistant:

double Alg::max_cover_lazy_budget_fast_end(const Graph & graph, const double budget,
        const std::vector<double> & budget_list, const double epsilon, double & timeb, const int mode) {
    // mode: optimization mode.
    // 0->no optimization,
    // 1->optimization with the upper bound in the last round,
    // 2->optimization with minimum upper bound among all rounds [Default].
    const double EPS = 0.0000000001;
    __boundLast = DBL_MAX, __boundMin = DBL_MAX;
    __boundLast_inf = DBL_MAX, __boundMin_inf = DBL_MAX;
    __boundLast_inf_cost = DBL_MAX, __boundMin_inf_cost = DBL_MAX;
    FRset coverage(__numV, 0);
    size_t maxDeg = 0;
    for (auto i = __numV; i--;) {
        const size_t deg = __hyperG._FRsets[i].size();
        coverage[i] = deg;
        if (deg > maxDeg) {
            maxDeg = deg;
        }
    }
    RRsets degMap(maxDeg + 1); // degMap: map degree to the nodes with this degree
    for (auto i = __numV; i--;) {
        if (coverage[i] == 0) {
            continue;
        }
        degMap[coverage[i]].push_back(i);
    }

    size_t sumInf = 0;
    int flag = 0;
    std::vector<bool> edgeMark(__numRRsets, false);
    // check if an edge is removed
    std::vector<bool> node_sel(__numV, false);
    double min_cost = min_vector_nonzero_mask(budget_list, node_sel);
    std::cout << "min_cost: " << min_cost << std::endl;

    __vecSeed_inf.clear();
    for (size_t deg = maxDeg; deg > 0; deg--) // Enusre deg > 0
    {
        if (min_cost > budget) {
            break;
        }
        auto & vecNode = degMap[deg];
        for (auto idx = vecNode.size(); idx--;) {
            auto argmaxIdx = vecNode[idx];
            const auto currDeg = coverage[argmaxIdx];
            if (deg > currDeg)
            {
                degMap[currDeg].push_back(argmaxIdx);
                continue;
            }
            if (budget_list[argmaxIdx] <= budget) {
                if (mode == 2) {
                    // Find upper bound
                    auto degBound = deg;
                    Nodelist vecBound;
                    // Initialize vecBound
                    auto idxBound = idx;
                    vecBound.push_back(coverage[degMap[degBound][idxBound]]);
                    __boundLast_inf = double(accumulate(vecBound.begin(), vecBound.end(), size_t(0))
                                             + sumInf) * __numV /__numRRsets;
                    if (__boundMin_inf > __boundLast_inf) {
                        __boundMin_inf = __boundLast_inf;
                    }
                }
                if (flag == 0) {
                    sumInf = sumInf + coverage[argmaxIdx];
                    __vecSeed_inf.push_back(argmaxIdx);
                    coverage[argmaxIdx] = 0;
                    for (auto edgeIdx : __hyperG._FRsets[argmaxIdx])
                    {
                        if (edgeMark[edgeIdx]) continue;
                        edgeMark[edgeIdx] = true;
                        for (auto nodeIdx : __hyperG._RRsets[edgeIdx])
                        {
                            if (coverage[nodeIdx] == 0) continue; // This node is seed, skip
                            coverage[nodeIdx]--;
                        }
                    }
                }
                flag = flag + 1;
            }
            if (flag == 2) {
                break;
            }
        }
        if (flag == 2) {
            break;
        }
        degMap.pop_back();
    }
    // Top-k influential nodes constructed
    const auto finalInf = 1.0 * sumInf * __numV / __numRRsets;
    std::cout << std::endl;
    std::cout << "  >>>[greedy-lazy] influence: " << sumInf << " " << finalInf <<
              ", min-bound: " << __boundMin_inf <<
              ", last-bound: " << __boundLast_inf << '\n';

    // cost influence most
    std::vector<double> coverage_cost(__numV, 0);
    double maxDeg_cost = 0;
    double minDeg_cost = DBL_MAX;
    for (auto i = __numV; i--;) {
        const size_t deg_cost = __hyperG._FRsets[i].size();
        if (fabs(budget_list[i]) <= EPS || deg_cost == 0) {
            coverage_cost[i] = 0;
        }
        else {
            coverage_cost[i] = (double) deg_cost / budget_list[i];
        }
        if (coverage_cost[i] > maxDeg_cost) {
            maxDeg_cost = coverage_cost[i];
        }
        if (coverage_cost[i] < minDeg_cost) {
            if (fabs(coverage_cost[i]) > EPS) {
                minDeg_cost = coverage_cost[i];
            }
        }
    }
    std::cout << "minDeg_cost: " <<  minDeg_cost << std::endl;

    size_t maxIdx_cost = 0;
    for (double deg_thr = maxDeg_cost; deg_thr >= minDeg_cost * (1 - epsilon); deg_thr = deg_thr * (1 - epsilon)) {
        maxIdx_cost++;
    }

    // initial reverse index
    RRsets degMap_cost(maxIdx_cost); // degMap: map degree threshold to the nodes over this threshold
    std::cout << "maxIdx_cost: " << maxIdx_cost << std::endl;
    size_t tmpidx_cost = maxIdx_cost - 1;
    for (double deg_thr = maxDeg_cost; deg_thr >= minDeg_cost * (1 - epsilon); deg_thr = deg_thr * (1 - epsilon)) {
        for (auto i = __numV; i--; ) {
            if (coverage_cost[i] >= deg_thr && coverage_cost[i] <= deg_thr / (1 - epsilon)) {
                degMap_cost[tmpidx_cost].push_back(i);
            }
        }
        if (tmpidx_cost == 0) {
            break;
        }
        tmpidx_cost--;
    }

    size_t sumInf_cost = 0;
    double sumBudget_cost = 0;
    // miss nodes
    std::vector<size_t> miss_nodes_vec;
    RRsets missMap_cost(maxIdx_cost);
    // check if an edge is removed
    std::vector<bool> edgeMark_cost(__numRRsets, false);
    std::vector<bool> node_sel_cost(__numV, false);
    min_cost = min_vector_nonzero_mask(budget_list, node_sel_cost);

    Timer timerBound("Bound");
    __vecSeed_inf_cost.clear();
    for (size_t degidx = degMap_cost.size(); degidx--; ) {
        if (sumBudget_cost + min_cost > budget) {
            break;
        }
        auto & vecNode = degMap_cost[degidx];
        for (size_t idx = vecNode.size(); idx--;) {
            auto argmaxIdx = vecNode[idx];
            const double currDeg = coverage_cost[argmaxIdx];
            if (sumBudget_cost + budget_list[argmaxIdx] <= budget) {
                if (mode == 2 || (mode == 1 && sumBudget_cost + budget_list[argmaxIdx] + min_cost > budget)) {
                    timerBound.get_operation_time();
                    // Find upper bound
                    auto degBound = degidx;
                    Nodelist vecBound;
                    double vecBound_Budget = 0;
                    // Initialize vecBound
                    auto idxBound = idx + 1;
                    size_t lastNum = 0;
                    double vecBound_Budget_Last = 0;
                    bool is_stop = false;
                    size_t tmp_miss_idx_cost = 0;
                    for (auto miss_idx = miss_nodes_vec.size(); miss_idx--; ) {
                        tmp_miss_idx_cost = maxIdx_cost - 1;
                        for (double miss_deg_thr = maxDeg_cost;
                                miss_deg_thr >= minDeg_cost * (1 - epsilon); miss_deg_thr = miss_deg_thr * (1 - epsilon)) {
                            if (coverage_cost[miss_nodes_vec[miss_idx]] >= miss_deg_thr &&
                                    coverage_cost[miss_nodes_vec[miss_idx]] <= miss_deg_thr / (1 - epsilon)) {
                                missMap_cost[tmp_miss_idx_cost].push_back(miss_nodes_vec[miss_idx]);
                                break;
                            }
                            if (tmp_miss_idx_cost == 0) {
                                break;
                            }
                            tmp_miss_idx_cost--;
                        }
                    }
                    auto miss_idxBound = missMap_cost[degBound].size();
                    if (is_stop == false) {
                        while (vecBound_Budget + min_cost <= budget && idxBound--) {
                            if (vecBound_Budget + budget_list[degMap_cost[degBound][idxBound]] <= budget) {
                                vecBound.push_back(coverage_cost[degMap_cost[degBound][idxBound]] *
                                                   budget_list[degMap_cost[degBound][idxBound]]);
                                vecBound_Budget = vecBound_Budget + budget_list[degMap_cost[degBound][idxBound]];
                                lastNum = lastNum + 1;
                            }
                            else {
                                vecBound.push_back(coverage_cost[degMap_cost[degBound][idxBound]] *
                                                   (budget - vecBound_Budget));
                                vecBound_Budget = budget;
                                is_stop = true;
                                break;
                            }
                        }
                        while (vecBound_Budget + min_cost <= budget && miss_idxBound--) {
                            if (vecBound_Budget + budget_list[missMap_cost[degBound][miss_idxBound]] <= budget) {
                                vecBound.push_back(coverage_cost[missMap_cost[degBound][miss_idxBound]] *
                                                   budget_list[missMap_cost[degBound][miss_idxBound]]);
                                vecBound_Budget = vecBound_Budget + budget_list[missMap_cost[degBound][miss_idxBound]];
                                lastNum = lastNum + 1;
                            }
                            else {
                                vecBound.push_back(coverage_cost[missMap_cost[degBound][miss_idxBound]] *
                                                   (budget - vecBound_Budget));
                                vecBound_Budget = budget;
                                is_stop = true;
                                break;
                            }
                        }
                    }
                    if (is_stop == false) {
                        while (vecBound_Budget + min_cost <= budget && --degBound) {
                            lastNum = 0;
                            vecBound_Budget_Last = vecBound_Budget;
                            idxBound = degMap_cost[degBound].size();
                            miss_idxBound = missMap_cost[degBound].size();
                            while (vecBound_Budget + min_cost <= budget && idxBound--) {
                                if (vecBound_Budget + budget_list[degMap_cost[degBound][idxBound]] <= budget) {
                                    vecBound.push_back(coverage_cost[degMap_cost[degBound][idxBound]] *
                                                       budget_list[degMap_cost[degBound][idxBound]]);
                                    vecBound_Budget = vecBound_Budget + budget_list[degMap_cost[degBound][idxBound]];
                                    lastNum = lastNum + 1;
                                }
                                else {
                                    vecBound.push_back(coverage_cost[degMap_cost[degBound][idxBound]] *
                                                       (budget - vecBound_Budget));
                                    vecBound_Budget = budget;
                                    is_stop = true;
                                    break;
                                }
                            }
                            while (vecBound_Budget + min_cost <= budget && miss_idxBound--) {
                                if (vecBound_Budget + budget_list[missMap_cost[degBound][miss_idxBound]] <= budget) {
                                    vecBound.push_back(coverage_cost[missMap_cost[degBound][miss_idxBound]] *
                                                       budget_list[missMap_cost[degBound][miss_idxBound]]);
                                    vecBound_Budget = vecBound_Budget + budget_list[missMap_cost[degBound][miss_idxBound]];
                                    lastNum = lastNum + 1;
                                }
                                else {
                                    vecBound.push_back(coverage_cost[missMap_cost[degBound][miss_idxBound]] *
                                                       (budget - vecBound_Budget));
                                    vecBound_Budget = budget;
                                    is_stop = true;
                                    break;
                                }
                            }
                            if (is_stop == true) {
                                break;
                            }
                        }
                    }
                    // roll back
                    if (lastNum != 0 && idxBound != 0) {
                        while (lastNum) {
                            vecBound.pop_back();
                            lastNum = lastNum - 1;
                        }
                        vecBound_Budget = vecBound_Budget_Last;
                        std::vector<std::pair<size_t, double>> vecNodeLastPair(degMap_cost[degBound].size()
                            + missMap_cost[degBound].size());
                        for (size_t idxpair = degMap_cost[degBound].size(); idxpair--; ) {
                            vecNodeLastPair[idxpair] = std::make_pair(degMap_cost[degBound][idxpair],
                                                                      coverage_cost[degMap_cost[degBound][idxpair]]);
                        }
                        for (size_t miss_idxpair = missMap_cost[degBound].size(); miss_idxpair--; ){
                            vecNodeLastPair[miss_idxpair + degMap_cost[degBound].size()] =
                                    std::make_pair(missMap_cost[degBound][miss_idxpair],
                                            coverage_cost[missMap_cost[degBound][miss_idxpair]]);
                        }
                        std::sort(vecNodeLastPair.begin(), vecNodeLastPair.end(), [](auto & left, auto & right){
                            return std::get<1>(left) < std::get<1>(right);
                        });
                        // choose max
                        idxBound = degMap_cost[degBound].size() + missMap_cost[degBound].size();
                        while (vecBound_Budget + min_cost <= budget && idxBound--) {
                            if (vecBound_Budget + budget_list[std::get<0>(vecNodeLastPair[idxBound])] <= budget) {
                                vecBound.push_back(coverage_cost[std::get<0>(vecNodeLastPair[idxBound])] *
                                                   budget_list[std::get<0>(vecNodeLastPair[idxBound])]);
                                vecBound_Budget = vecBound_Budget + budget_list[std::get<0>(vecNodeLastPair[idxBound])];
                            }
                            else {
                                vecBound.push_back(coverage_cost[std::get<0>(vecNodeLastPair[idxBound])] *
                                                   (budget- vecBound_Budget));
                                vecBound_Budget = budget;
                            }
                        }
                    }
                    else if (idxBound == 0 && vecBound_Budget < budget) {
                        double max_coverage_ratio = 0.0;
                        degBound = degBound - 1;
                        for (size_t idxpair = degMap_cost[degBound].size(); idxpair--; ) {
                            if (coverage_cost[degMap_cost[degBound][idxpair]] > max_coverage_ratio) {
                                max_coverage_ratio = coverage_cost[degMap_cost[degBound][idxpair]];
                            }
                        }
                        for (size_t miss_idxpair = missMap_cost[degBound].size(); miss_idxpair--; ) {
                            if (coverage_cost[missMap_cost[degBound][miss_idxpair]] > max_coverage_ratio) {
                                max_coverage_ratio = coverage_cost[missMap_cost[degBound][miss_idxpair]];
                            }
                        }
                        vecBound.push_back(max_coverage_ratio * (budget- vecBound_Budget));
                    }
                    std::sort(vecBound.begin(), vecBound.end());
                    make_min_heap(vecBound);
                    __boundLast_inf_cost = double(accumulate(vecBound.begin(), vecBound.end(), size_t(0))
                                                  + sumInf_cost) * __numV /__numRRsets;
                    if (__boundMin_inf_cost > __boundLast_inf_cost) {
                        __boundMin_inf_cost = __boundLast_inf_cost;
                    }
                    timeb += timerBound.get_operation_time();
                }
                sumInf_cost = sumInf_cost + currDeg * budget_list[argmaxIdx];
                __vecSeed_inf_cost.push_back(argmaxIdx);
                sumBudget_cost = sumBudget_cost + budget_list[argmaxIdx];
                coverage_cost[argmaxIdx] = 0;
                node_sel_cost[argmaxIdx] = true;
                min_cost = min_vector_nonzero_mask(budget_list, node_sel_cost);
                for (auto edgeIdx : __hyperG._FRsets[argmaxIdx]) {
                    if (edgeMark_cost[edgeIdx]) {
                        continue;
                    }
                    edgeMark_cost[edgeIdx] = true;
                    for (auto nodeIdx : __hyperG._RRsets[edgeIdx]) {
                        if (fabs(coverage_cost[nodeIdx]) <= EPS) {
                            continue; // This node is seed, skip
                        }
                        if (fabs(budget_list[nodeIdx]) >= EPS) {
                            coverage_cost[nodeIdx] = (coverage_cost[nodeIdx] * budget_list[nodeIdx] - 1) /
                                                     budget_list[nodeIdx];
                        } else {
                            coverage_cost[nodeIdx] = 0;
                        }
                    }
                }
                degMap_cost[degidx].pop_back();
            }
            else {
                if (fabs(coverage_cost[argmaxIdx]) > EPS) {
                    miss_nodes_vec.push_back(argmaxIdx);
//                    std::cout << "miss node size: " << miss_nodes_vec.size() << std::endl;
                }
                degMap_cost[degidx].pop_back();
            }
            if (sumBudget_cost + min_cost > budget) {
                break;
            }
        }
        degMap_cost.pop_back();
    }
    const auto finalInf_cost = 1.0 * sumInf_cost * __numV / __numRRsets;
    std::cout << "  >>>[greedy-lazy] influence_cost: " << sumInf_cost << " " <<
              finalInf_cost << ", min-bound_cost: " <<
              __boundMin_inf_cost << ", last-bound_cost: " << __boundLast_inf_cost << '\n';

    if (finalInf > finalInf_cost) {
        __vecSeed.clear();
        __vecSeed.assign(__vecSeed_inf.begin(), __vecSeed_inf.end());
        std::cout << "Inf: " <<  __vecSeed.size() << std::endl;
        __is_inf_cost = false;
        return finalInf;
    }
    else {
        __vecSeed.clear();
        __vecSeed.assign(__vecSeed_inf_cost.begin(), __vecSeed_inf_cost.end());
        std::cout << "Cost Inf: " << __vecSeed.size() << std::endl;
        __is_inf_cost = true;
        return finalInf_cost;
    }
}